

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpsession.cpp
# Opt level: O0

int __thiscall jrtplib::RTPSession::Poll(RTPSession *this)

{
  int status;
  RTPSession *this_local;
  
  if ((this->created & 1U) == 0) {
    this_local._4_4_ = -0x3e;
  }
  else if ((this->usingpollthread & 1U) == 0) {
    this_local._4_4_ = (*(this->rtptrans->super_RTPMemoryObject)._vptr_RTPMemoryObject[10])();
    if (-1 < this_local._4_4_) {
      this_local._4_4_ = ProcessPolledData(this);
    }
  }
  else {
    this_local._4_4_ = -0x40;
  }
  return this_local._4_4_;
}

Assistant:

int RTPSession::Poll()
{
	int status;
	
	if (!created)
		return ERR_RTP_SESSION_NOTCREATED;
	if (usingpollthread)
		return ERR_RTP_SESSION_USINGPOLLTHREAD;
	if ((status = rtptrans->Poll()) < 0)
		return status;
	return ProcessPolledData();
}